

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

int LS_Sector_SetPlaneReflection
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  sector_t *psVar1;
  bool bVar2;
  int iVar3;
  sector_t *s;
  FSectorTagIterator itr;
  int secnum;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  itr.start = arg2;
  FSectorTagIterator::FSectorTagIterator((FSectorTagIterator *)((long)&s + 4),arg0);
  while (iVar3 = FSectorTagIterator::Next((FSectorTagIterator *)((long)&s + 4)), psVar1 = sectors,
        -1 < iVar3) {
    itr.searchtag = iVar3;
    bVar2 = secplane_t::isSlope(&sectors[iVar3].floorplane);
    if (!bVar2) {
      psVar1[iVar3].reflect[0] = (float)arg1 / 255.0;
    }
    bVar2 = secplane_t::isSlope(&psVar1[iVar3].ceilingplane);
    if (!bVar2) {
      sectors[itr.searchtag].reflect[1] = (float)itr.start / 255.0;
    }
  }
  return 1;
}

Assistant:

int LS_Sector_SetPlaneReflection (line_t *ln, AActor *it, bool backSide,
	int arg0, int arg1, int arg2, int arg3, int arg4)
{
// Sector_SetPlaneReflection (tag, floor, ceiling)
	int secnum;
	FSectorTagIterator itr(arg0);

	while ((secnum = itr.Next()) >= 0)
	{
		sector_t * s = &sectors[secnum];
		if (!s->floorplane.isSlope()) s->reflect[sector_t::floor] = arg1/255.f;
		if (!s->ceilingplane.isSlope()) sectors[secnum].reflect[sector_t::ceiling] = arg2/255.f;
	}

	return true;
}